

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::anon_unknown_28::PositiveAndNegativeUnitTestFilter::
PositiveAndNegativeUnitTestFilter(PositiveAndNegativeUnitTestFilter *this,string *filter)

{
  ulong uVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  UnitTestFilter local_d0;
  undefined1 local_80 [8];
  value_type negative_filter_string;
  undefined1 auStack_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  positive_and_negative_filters;
  allocator<char> local_31;
  
  (this->positive_filter_).glob_patterns_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->positive_filter_).glob_patterns_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->positive_filter_).glob_patterns_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->positive_filter_).exact_match_patterns_._M_h._M_buckets =
       &(this->positive_filter_).exact_match_patterns_._M_h._M_single_bucket;
  (this->positive_filter_).exact_match_patterns_._M_h._M_bucket_count = 1;
  (this->positive_filter_).exact_match_patterns_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->positive_filter_).exact_match_patterns_._M_h._M_element_count = 0;
  (this->positive_filter_).exact_match_patterns_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  negative_filter_string.field_2._8_8_ = &this->negative_filter_;
  (this->negative_filter_).glob_patterns_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->positive_filter_).exact_match_patterns_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->positive_filter_).exact_match_patterns_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->negative_filter_).glob_patterns_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->negative_filter_).glob_patterns_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->negative_filter_).exact_match_patterns_._M_h._M_buckets =
       &(this->negative_filter_).exact_match_patterns_._M_h._M_single_bucket;
  (this->negative_filter_).exact_match_patterns_._M_h._M_bucket_count = 1;
  (this->negative_filter_).exact_match_patterns_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->negative_filter_).exact_match_patterns_._M_h._M_element_count = 0;
  (this->negative_filter_).exact_match_patterns_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->negative_filter_).exact_match_patterns_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->negative_filter_).exact_match_patterns_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  auStack_58 = (undefined1  [8])0x0;
  positive_and_negative_filters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  positive_and_negative_filters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  SplitString((string *)FLAGS_gtest_filter_abi_cxx11_,'-',
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_58);
  if ((ulong)((long)positive_and_negative_filters.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58) < 0x21) {
    UnitTestFilter::UnitTestFilter(&local_d0,(string *)auStack_58);
    UnitTestFilter::operator=(&this->positive_filter_,&local_d0);
    UnitTestFilter::~UnitTestFilter(&local_d0);
  }
  else {
    positive_and_negative_filters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
    if (*(size_type *)((long)auStack_58 + 8) == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"*",&local_31);
    }
    else {
      std::__cxx11::string::string((string *)local_80,(string *)auStack_58);
    }
    UnitTestFilter::UnitTestFilter(&local_d0,(string *)local_80);
    UnitTestFilter::operator=(&this->positive_filter_,&local_d0);
    UnitTestFilter::~UnitTestFilter(&local_d0);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::string((string *)local_80,(string *)((long)auStack_58 + 0x20));
    lVar2 = 0x40;
    for (uVar1 = 2;
        uVar1 < (ulong)((long)positive_and_negative_filters.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 5);
        uVar1 = uVar1 + 1) {
      std::operator+(&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     '-');
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                     &local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((_Alloc_hider *)auStack_58)->_M_p + lVar2));
      std::__cxx11::string::operator=((string *)local_80,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      lVar2 = lVar2 + 0x20;
    }
    UnitTestFilter::UnitTestFilter(&local_d0,(string *)local_80);
    UnitTestFilter::operator=((UnitTestFilter *)negative_filter_string.field_2._8_8_,&local_d0);
    UnitTestFilter::~UnitTestFilter(&local_d0);
    std::__cxx11::string::~string((string *)local_80);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_58);
  return;
}

Assistant:

explicit PositiveAndNegativeUnitTestFilter(const std::string& filter) {
    std::vector<std::string> positive_and_negative_filters;

    // NOTE: `SplitString` always returns a non-empty container.
    SplitString(filter, '-', &positive_and_negative_filters);
    const auto& positive_filter = positive_and_negative_filters.front();

    if (positive_and_negative_filters.size() > 1) {
      positive_filter_ = UnitTestFilter(
          positive_filter.empty() ? kUniversalFilter : positive_filter);

      // TODO(b/214626361): Fail on multiple '-' characters
      // For the moment to preserve old behavior we concatenate the rest of the
      // string parts with `-` as separator to generate the negative filter.
      auto negative_filter_string = positive_and_negative_filters[1];
      for (std::size_t i = 2; i < positive_and_negative_filters.size(); i++)
        negative_filter_string =
            negative_filter_string + '-' + positive_and_negative_filters[i];
      negative_filter_ = UnitTestFilter(negative_filter_string);
    } else {
      // In case we don't have a negative filter and positive filter is ""
      // we do not use kUniversalFilter by design as opposed to when we have a
      // negative filter.
      positive_filter_ = UnitTestFilter(positive_filter);
    }
  }